

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall TestAbortInternal::Run(TestAbortInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> *in_RDX;
  string local_50;
  testinator local_30 [8];
  char *local_28;
  undefined4 local_20;
  
  this->m_runCalled = true;
  pOVar1 = (this->super_Test).m_op;
  local_28 = "Hello world ";
  local_20 = 0x2a;
  testinator::Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,int>>>
            (&local_50,local_30,in_RDX);
  (*pOVar1->_vptr_Outputter[5])(pOVar1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ((this->super_Test).m_registry)->m_abort = true;
  return true;
}

Assistant:

virtual bool Run()
  {
    m_runCalled = true;
    ABORT("Hello world " << 42);
    return true;
  }